

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * luaG_findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  int iVar1;
  Proto *f;
  bool bVar2;
  char *pcVar3;
  CallInfo *pCVar4;
  StkId pSVar5;
  
  pSVar5 = (ci->func).p;
  if ((ci->callstatus & 2) == 0) {
    f = *(Proto **)((pSVar5->val).value_.f + 0x18);
    if (n < 0) {
      if (f->is_vararg == '\0') {
        return (char *)0x0;
      }
      iVar1 = (ci->u).l.nextraargs;
      if (n < -iVar1) {
        return (char *)0x0;
      }
      pSVar5 = pSVar5 + ((ulong)(uint)~n - (long)iVar1);
      pcVar3 = "(vararg)";
      goto LAB_0013f1fb;
    }
    pcVar3 = luaF_getlocalname(f,n,(int)((ulong)((long)(ci->u).l.savedpc - (long)f->code) >> 2) + -1
                              );
  }
  else {
    pcVar3 = (char *)0x0;
  }
  if (pcVar3 == (char *)0x0) {
    if (L->ci == ci) {
      pCVar4 = (CallInfo *)&L->top;
    }
    else {
      pCVar4 = ci->next;
    }
    bVar2 = (long)(pCVar4->func).p - (long)(pSVar5 + 1) >> 4 < (long)n;
    if (n < 1 || bVar2) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = "(C temporary)";
      if ((ci->callstatus & 2) == 0) {
        pcVar3 = "(temporary)";
      }
    }
    if (n < 1 || bVar2) {
      return (char *)0x0;
    }
  }
  if (pos == (StkId *)0x0) {
    return pcVar3;
  }
  pSVar5 = pSVar5 + 1 + (long)n + -1;
LAB_0013f1fb:
  *pos = pSVar5;
  return pcVar3;
}

Assistant:

const char *luaG_findlocal (lua_State *L, CallInfo *ci, int n, StkId *pos) {
  StkId base = ci->func.p + 1;
  const char *name = NULL;
  if (isLua(ci)) {
    if (n < 0)  /* access to vararg values? */
      return findvararg(ci, n, pos);
    else
      name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
  }
  if (name == NULL) {  /* no 'standard' name? */
    StkId limit = (ci == L->ci) ? L->top.p : ci->next->func.p;
    if (limit - base >= n && n > 0) {  /* is 'n' inside 'ci' stack? */
      /* generic name for any valid slot */
      name = isLua(ci) ? "(temporary)" : "(C temporary)";
    }
    else
      return NULL;  /* no name */
  }
  if (pos)
    *pos = base + (n - 1);
  return name;
}